

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_slot_allocator_alloc(ma_slot_allocator *pAllocator,ma_uint64 *pSlot)

{
  uint *puVar1;
  ma_uint32 mVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *in_RSI;
  long *in_RDI;
  bool bVar5;
  ma_uint32 slotIndex;
  ma_uint32 bitOffset;
  ma_uint32 newBitfield;
  ma_uint32 oldBitfield;
  ma_uint32 iGroup;
  ma_uint32 maxAttempts;
  ma_uint32 iAttempt;
  ma_uint32 cap;
  uint local_4c;
  uint local_44;
  ma_result local_2c;
  uint local_14;
  uint local_8;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == (undefined8 *)0x0)) {
    local_2c = MA_INVALID_ARGS;
  }
  else {
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      local_4c = 0;
      while( true ) {
        local_8 = *(uint *)((long)in_RDI + 0x14) >> 5;
        if ((*(uint *)((long)in_RDI + 0x14) & 0x1f) != 0) {
          local_8 = local_8 + 1;
        }
        if (local_8 <= local_4c) break;
        while (uVar4 = *(uint *)(*in_RDI + (ulong)local_4c * 4), uVar4 != 0xffffffff) {
          mVar2 = ma_ffs_32(~uVar4);
          puVar1 = (uint *)(*in_RDI + (ulong)local_4c * 4);
          LOCK();
          uVar3 = *puVar1;
          bVar5 = uVar4 == uVar3;
          if (bVar5) {
            *puVar1 = uVar4 | 1 << (mVar2 & 0x1f);
            uVar3 = uVar4;
          }
          UNLOCK();
          local_14 = uVar4;
          if (!bVar5) {
            local_14 = uVar3;
          }
          if (local_14 == uVar4) {
            LOCK();
            *(int *)(in_RDI + 2) = (int)in_RDI[2] + 1;
            UNLOCK();
            uVar4 = local_4c * 0x20 + mVar2;
            if (*(uint *)((long)in_RDI + 0x14) <= uVar4) {
              return MA_OUT_OF_MEMORY;
            }
            *(int *)(in_RDI[1] + (ulong)uVar4 * 4) = *(int *)(in_RDI[1] + (ulong)uVar4 * 4) + 1;
            *in_RSI = CONCAT44(*(undefined4 *)(in_RDI[1] + (ulong)uVar4 * 4),uVar4);
            return MA_SUCCESS;
          }
        }
        local_4c = local_4c + 1;
      }
      if (*(uint *)((long)in_RDI + 0x14) <= *(uint *)(in_RDI + 2)) {
        return MA_OUT_OF_MEMORY;
      }
    }
    local_2c = MA_OUT_OF_MEMORY;
  }
  return local_2c;
}

Assistant:

MA_API ma_result ma_slot_allocator_alloc(ma_slot_allocator* pAllocator, ma_uint64* pSlot)
{
    ma_uint32 iAttempt;
    const ma_uint32 maxAttempts = 2;    /* The number of iterations to perform until returning MA_OUT_OF_MEMORY if no slots can be found. */

    if (pAllocator == NULL || pSlot == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iAttempt = 0; iAttempt < maxAttempts; iAttempt += 1) {
        /* We need to acquire a suitable bitfield first. This is a bitfield that's got an available slot within it. */
        ma_uint32 iGroup;
        for (iGroup = 0; iGroup < ma_slot_allocator_group_capacity(pAllocator); iGroup += 1) {
            /* CAS */
            for (;;) {
                ma_uint32 oldBitfield;
                ma_uint32 newBitfield;
                ma_uint32 bitOffset;

                oldBitfield = ma_atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */

                /* Fast check to see if anything is available. */
                if (oldBitfield == 0xFFFFFFFF) {
                    break;  /* No available bits in this bitfield. */
                }

                bitOffset = ma_ffs_32(~oldBitfield);
                MA_ASSERT(bitOffset < 32);

                newBitfield = oldBitfield | (1 << bitOffset);

                if (ma_atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
                    ma_uint32 slotIndex;

                    /* Increment the counter as soon as possible to have other threads report out-of-memory sooner than later. */
                    ma_atomic_fetch_add_32(&pAllocator->count, 1);

                    /* The slot index is required for constructing the output value. */
                    slotIndex = (iGroup << 5) + bitOffset;  /* iGroup << 5 = iGroup * 32 */
                    if (slotIndex >= pAllocator->capacity) {
                        return MA_OUT_OF_MEMORY;
                    }

                    /* Increment the reference count before constructing the output value. */
                    pAllocator->pSlots[slotIndex] += 1;

                    /* Construct the output value. */
                    *pSlot = (((ma_uint64)pAllocator->pSlots[slotIndex] << 32) | slotIndex);

                    return MA_SUCCESS;
                }
            }
        }

        /* We weren't able to find a slot. If it's because we've reached our capacity we need to return MA_OUT_OF_MEMORY. Otherwise we need to do another iteration and try again. */
        if (pAllocator->count < pAllocator->capacity) {
            ma_yield();
        } else {
            return MA_OUT_OF_MEMORY;
        }
    }

    /* We couldn't find a slot within the maximum number of attempts. */
    return MA_OUT_OF_MEMORY;
}